

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

asn_enc_rval_t *
OCTET_STRING_encode_uper
          (asn_TYPE_descriptor_t *td,asn_per_constraints_t *constraints,void *sptr,
          asn_per_outp_t *po)

{
  asn_per_constraint_flags aVar1;
  int iVar2;
  ulong ub;
  ssize_t sVar3;
  long *in_RCX;
  asn_per_constraints_t *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  asn_enc_rval_t *tmp_error;
  ssize_t maySave;
  int ct_extensible;
  anon_enum_32 bpc;
  int ret;
  uint8_t *buf;
  uint sizeinunits;
  uint canonical_unit_bits;
  uint unit_bits;
  int inext;
  asn_enc_rval_t er;
  BIT_STRING_t *st;
  asn_per_constraint_t *csiz;
  asn_per_constraint_t *cval;
  asn_per_constraints_t *pc;
  asn_OCTET_STRING_specifics_t *specs;
  undefined8 in_stack_fffffffffffffee8;
  long lVar4;
  asn_per_outp_t *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  asn_per_outp_t *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  uint8_t *in_stack_ffffffffffffff20;
  asn_per_outp_t *in_stack_ffffffffffffff28;
  char *local_d0;
  char *local_c8;
  asn_per_constraints_t *in_stack_ffffffffffffff48;
  char *pcVar5;
  asn_per_constraints_t *local_b0;
  asn_OCTET_STRING_specifics_t *local_a8;
  int local_80;
  int local_7c;
  uint local_70;
  uint local_68;
  ssize_t local_60 [3];
  long *local_48;
  asn_per_constraint_s *local_40;
  asn_per_constraints_t *local_38;
  asn_per_constraints_t *local_30;
  asn_OCTET_STRING_specifics_t *local_28;
  long *local_18;
  asn_TYPE_descriptor_s *local_8;
  uint nbits;
  
  if (in_RSI->specifics == (void *)0x0) {
    local_a8 = &asn_DEF_OCTET_STRING_specs;
  }
  else {
    local_a8 = (asn_OCTET_STRING_specifics_t *)in_RSI->specifics;
  }
  local_28 = local_a8;
  local_b0 = in_RDX;
  if (in_RDX == (asn_per_constraints_t *)0x0) {
    local_b0 = in_RSI->per_constraints;
  }
  local_30 = local_b0;
  local_48 = in_RCX;
  local_18 = in_RCX;
  local_8 = in_RSI;
  memset(local_60,0,0x18);
  if ((local_48 == (long *)0x0) || ((*local_48 == 0 && ((int)local_48[1] != 0)))) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = local_8;
    in_RDI->structure_ptr = local_18;
    if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = local_8->name;
    }
    ASN_DEBUG("Failed to encode element %s",pcVar5);
  }
  else {
    if (local_30 == (asn_per_constraints_t *)0x0) {
      local_38 = &asn_DEF_OCTET_STRING_constraints;
    }
    else {
      local_38 = local_30;
    }
    local_40 = &local_38->size;
    aVar1 = local_40->flags & APC_EXTENSIBLE;
    ub = (ulong)local_28->subvariant;
    switch(ub) {
    default:
      in_RDI->encoded = -1;
      in_RDI->failed_type = local_8;
      in_RDI->structure_ptr = local_18;
      if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
        local_c8 = "";
      }
      else {
        local_c8 = local_8->name;
      }
      ASN_DEBUG("Failed to encode element %s",local_c8);
      return in_RDI;
    case 1:
      local_68 = 1;
      local_80 = 0;
      local_70 = (int)local_48[1] * 8 - (*(uint *)((long)local_48 + 0xc) & 7);
      ASN_DEBUG("BIT STRING of %d bytes, %d bits unused",(ulong)local_70,
                (ulong)*(uint *)((long)local_48 + 0xc));
      break;
    case 2:
      local_68 = 8;
      if (((local_38->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
        local_68 = (local_38->value).range_bits;
      }
      local_80 = 1;
      local_70 = *(uint *)(local_48 + 1);
      break;
    case 3:
      local_68 = 0x10;
      if (((local_38->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
        local_68 = (local_38->value).range_bits;
      }
      local_80 = 2;
      local_70 = (int)local_48[1] / 2;
      break;
    case 4:
      local_68 = 0x20;
      if (((local_38->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
        local_68 = (local_38->value).range_bits;
      }
      local_80 = 4;
      local_70 = (int)local_48[1] / 4;
    }
    pcVar5 = "";
    if (aVar1 != APC_UNCONSTRAINED) {
      pcVar5 = " EXT";
    }
    nbits = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    lVar4 = (ulong)nbits << 0x20;
    ASN_DEBUG("Encoding %s into %d units of %d bits (%ld..%ld, effective %d)%s",local_8->name,
              (ulong)local_70,(ulong)local_68,local_40->lower_bound,local_40->upper_bound);
    if ((-1 < local_40->effective_bits) &&
       (((long)(int)local_70 < local_40->lower_bound ||
        (local_40->upper_bound < (long)(int)local_70)))) {
      if (aVar1 == APC_UNCONSTRAINED) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_8;
        in_RDI->structure_ptr = local_18;
        if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
          local_d0 = "";
        }
        else {
          local_d0 = local_8->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_d0);
        return in_RDI;
      }
      local_38 = &asn_DEF_OCTET_STRING_constraints;
      local_40 = &asn_DEF_OCTET_STRING_constraints.size;
    }
    if ((aVar1 == APC_UNCONSTRAINED) ||
       (iVar2 = per_put_few_bits(in_stack_ffffffffffffff28,
                                 (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                 (int)in_stack_ffffffffffffff20), iVar2 == 0)) {
      if (local_40->effective_bits < 0) {
        ASN_DEBUG("Encoding %d bytes",(ulong)*(uint *)(local_48 + 1));
        if (local_70 == 0) {
          sVar3 = uper_put_length(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          if (sVar3 == 0) {
            in_RDI->encoded = local_60[0];
            in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
            in_RDI->structure_ptr = (void *)0x0;
          }
          else {
            in_RDI->encoded = -1;
            in_RDI->failed_type = local_8;
            in_RDI->structure_ptr = local_18;
            if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = local_8->name;
            }
            ASN_DEBUG("Failed to encode element %s",pcVar5);
          }
        }
        else {
          for (; local_70 != 0; local_70 = local_70 - (int)sVar3) {
            sVar3 = uper_put_length(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
            if (sVar3 < 0) {
              in_RDI->encoded = -1;
              in_RDI->failed_type = local_8;
              in_RDI->structure_ptr = local_18;
              if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = local_8->name;
              }
              ASN_DEBUG("Failed to encode element %s",pcVar5);
              return in_RDI;
            }
            ASN_DEBUG("Encoding %ld of %ld",sVar3,(ulong)local_70);
            if (local_80 == 0) {
              local_7c = per_put_many_bits(in_stack_fffffffffffffef8,(uint8_t *)pcVar5,
                                           (int)((ulong)lVar4 >> 0x20));
            }
            else {
              lVar4 = (local_38->value).upper_bound;
              pcVar5 = (char *)local_30;
              local_7c = OCTET_STRING_per_put_characters
                                   (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                    in_stack_ffffffffffffff18,
                                    (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                    (uint)in_stack_ffffffffffffff10,(long)in_stack_ffffffffffffff08,
                                    ub,in_stack_ffffffffffffff48);
            }
            if (local_7c != 0) {
              in_RDI->encoded = -1;
              in_RDI->failed_type = local_8;
              in_RDI->structure_ptr = local_18;
              if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = local_8->name;
              }
              ASN_DEBUG("Failed to encode element %s",pcVar5);
              return in_RDI;
            }
          }
          in_RDI->encoded = local_60[0];
          in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
          in_RDI->structure_ptr = (void *)0x0;
        }
      }
      else {
        ASN_DEBUG("Encoding %d bytes (%ld), length in %d bits",(ulong)*(uint *)(local_48 + 1),
                  (ulong)local_70 - local_40->lower_bound,(ulong)(uint)local_40->effective_bits);
        iVar2 = per_put_few_bits(in_stack_ffffffffffffff28,
                                 (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                 (int)in_stack_ffffffffffffff20);
        if (iVar2 == 0) {
          if (local_80 == 0) {
            local_7c = per_put_many_bits(in_stack_fffffffffffffef8,(uint8_t *)pcVar5,nbits);
          }
          else {
            local_7c = OCTET_STRING_per_put_characters
                                 (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                  in_stack_ffffffffffffff18,
                                  (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                  (uint)in_stack_ffffffffffffff10,(long)in_stack_ffffffffffffff08,ub
                                  ,in_stack_ffffffffffffff48);
          }
          if (local_7c == 0) {
            in_RDI->encoded = local_60[0];
            in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
            in_RDI->structure_ptr = (void *)0x0;
          }
          else {
            in_RDI->encoded = -1;
            in_RDI->failed_type = local_8;
            in_RDI->structure_ptr = local_18;
            if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = local_8->name;
            }
            ASN_DEBUG("Failed to encode element %s",pcVar5);
          }
        }
        else {
          in_RDI->encoded = -1;
          in_RDI->failed_type = local_8;
          in_RDI->structure_ptr = local_18;
          if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = local_8->name;
          }
          ASN_DEBUG("Failed to encode element %s",pcVar5);
        }
      }
    }
    else {
      in_RDI->encoded = -1;
      in_RDI->failed_type = local_8;
      in_RDI->structure_ptr = local_18;
      if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = local_8->name;
      }
      ASN_DEBUG("Failed to encode element %s",pcVar5);
    }
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_uper(asn_TYPE_descriptor_t *td,
        asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	asn_enc_rval_t er = { 0, 0, 0 };
	int inext = 0;		/* Lies not within extension root */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;
	unsigned int sizeinunits;
	const uint8_t *buf;
	int ret;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	int ct_extensible;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}
	ct_extensible = csiz->flags & APC_EXTENSIBLE;

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN__ENCODE_FAILED;
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		sizeinunits = st->size * 8 - (st->bits_unused & 0x07);
		ASN_DEBUG("BIT STRING of %d bytes, %d bits unused",
				sizeinunits, st->bits_unused);
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		sizeinunits = st->size;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		sizeinunits = st->size / 2;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		sizeinunits = st->size / 4;
		break;
	}

	ASN_DEBUG("Encoding %s into %d units of %d bits"
		" (%ld..%ld, effective %d)%s",
		td->name, sizeinunits, unit_bits,
		csiz->lower_bound, csiz->upper_bound,
		csiz->effective_bits, ct_extensible ? " EXT" : "");

	/* Figure out whether size lies within PER visible constraint */

	if(csiz->effective_bits >= 0) {
		if((int)sizeinunits < csiz->lower_bound
		|| (int)sizeinunits > csiz->upper_bound) {
			if(ct_extensible) {
				cval = &asn_DEF_OCTET_STRING_constraints.value;
				csiz = &asn_DEF_OCTET_STRING_constraints.size;
				unit_bits = canonical_unit_bits;
				inext = 1;
			} else
				ASN__ENCODE_FAILED;
		}
	} else {
		inext = 0;
	}

	if(ct_extensible) {
		/* Declare whether length is [not] within extension root */
		if(per_put_few_bits(po, inext, 1))
			ASN__ENCODE_FAILED;
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits >= 0) {
		ASN_DEBUG("Encoding %d bytes (%ld), length in %d bits",
				st->size, sizeinunits - csiz->lower_bound,
				csiz->effective_bits);
		ret = per_put_few_bits(po, sizeinunits - csiz->lower_bound,
				csiz->effective_bits);
		if(ret) ASN__ENCODE_FAILED;
		if(bpc) {
			ret = OCTET_STRING_per_put_characters(po, st->buf,
				sizeinunits, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
		} else {
			ret = per_put_many_bits(po, st->buf,
				sizeinunits * unit_bits);
		}
		if(ret) ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	ASN_DEBUG("Encoding %d bytes", st->size);

	if(sizeinunits == 0) {
		if(uper_put_length(po, 0))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	buf = st->buf;
	while(sizeinunits) {
		ssize_t maySave = uper_put_length(po, sizeinunits);
		if(maySave < 0) ASN__ENCODE_FAILED;

		ASN_DEBUG("Encoding %ld of %ld",
			(long)maySave, (long)sizeinunits);

		if(bpc) {
			ret = OCTET_STRING_per_put_characters(po, buf,
				maySave, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
		} else {
			ret = per_put_many_bits(po, buf, maySave * unit_bits);
		}
		if(ret) ASN__ENCODE_FAILED;

		if(bpc)
			buf += maySave * bpc;
		else
			buf += maySave >> 3;
		sizeinunits -= maySave;
		assert(!(maySave & 0x07) || !sizeinunits);
	}

	ASN__ENCODED_OK(er);
}